

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.h
# Opt level: O0

bool __thiscall
AggregateIndexes::isIncrement
          (AggregateIndexes *this,AggregateIndexes *bench,size_t *offset,bitset<7UL> *increasing)

{
  bool bVar1;
  byte bVar2;
  long *in_RDX;
  long in_RSI;
  reference *in_RDI;
  size_t i_1;
  size_t i;
  undefined5 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8d;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  bitset<7UL> *in_stack_ffffffffffffff98;
  bitset<7UL> *in_stack_ffffffffffffffa0;
  reference local_58;
  ulong local_48;
  reference local_40;
  ulong local_30;
  long *local_20;
  long local_18;
  bool local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  bVar1 = std::bitset<7UL>::operator!=
                    ((bitset<7UL> *)in_RDI,
                     (bitset<7UL> *)
                     CONCAT17(in_stack_ffffffffffffff8f,
                              CONCAT16(in_stack_ffffffffffffff8e,
                                       CONCAT15(in_stack_ffffffffffffff8d,in_stack_ffffffffffffff88)
                                      )));
  if (bVar1) {
    local_1 = false;
  }
  else if (*local_20 == 0) {
    std::bitset<7UL>::reset((bitset<7UL> *)in_RDI);
    for (local_30 = 0; local_30 < 7; local_30 = local_30 + 1) {
      std::bitset<7UL>::operator[](in_stack_ffffffffffffff98,(size_t)in_RDI);
      bVar2 = std::bitset::reference::operator_cast_to_bool(in_RDI);
      std::bitset<7UL>::reference::~reference(&local_40);
      if ((bVar2 & 1) != 0) {
        if ((&in_RDI->_M_bpos)[local_30] == *(long *)(local_18 + 8 + local_30 * 8) + 1U) {
          std::bitset<7UL>::set
                    (in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98,
                     SUB81((ulong)in_RDI >> 0x38,0));
        }
        else if ((&in_RDI->_M_bpos)[local_30] != *(size_t *)(local_18 + 8 + local_30 * 8)) {
          return false;
        }
      }
    }
    local_1 = true;
  }
  else {
    for (local_48 = 0; local_48 < 7; local_48 = local_48 + 1) {
      std::bitset<7UL>::operator[](in_stack_ffffffffffffff98,(size_t)in_RDI);
      bVar2 = std::bitset::reference::operator_cast_to_bool(in_RDI);
      std::bitset<7UL>::reference::~reference(&local_58);
      if ((bVar2 & 1) != 0) {
        std::bitset<7UL>::operator[](in_stack_ffffffffffffff98,(size_t)in_RDI);
        bVar2 = std::bitset::reference::operator_cast_to_bool(in_RDI);
        std::bitset<7UL>::reference::~reference((reference *)&stack0xffffffffffffff98);
        if ((bVar2 & 1) == 0) {
          if ((&in_RDI->_M_bpos)[local_48] != *(size_t *)(local_18 + 8 + local_48 * 8)) {
            return false;
          }
        }
        else if ((&in_RDI->_M_bpos)[local_48] !=
                 *(long *)(local_18 + 8 + local_48 * 8) + *local_20 + 1U) {
          return false;
        }
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool isIncrement(const AggregateIndexes& bench, const size_t& offset,
                     std::bitset<7>& increasing)
    {
        if (present != bench.present)
            return false;
        
        // If offset is zero we didn't compare any two tuples yet
        if (offset==0)
        {
            // compare this and bench
            increasing.reset();
            for (size_t i = 0; i < 7; i++)
            {
                if (present[i])
                {
                    if (indexes[i] == bench.indexes[i] + 1)
                    {
                        increasing.set(i);
                    }
                    else if (indexes[i] != bench.indexes[i])
                    {
                        return false;
                    }
                }
            }
            return true;
        }
        
        for (size_t i = 0; i < 7; i++)
        {
            if (present[i])
            {
                if (increasing[i])
                {
                    if (indexes[i] != bench.indexes[i] + offset + 1)
                        return false;
                }
                else
                {
                    if (indexes[i] != bench.indexes[i])
                        return false;
                }
            }
        }
        return true;
    }